

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_system_memory.c
# Opt level: O0

SUNErrCode
SUNMemoryHelper_Alloc_Sys
          (SUNMemoryHelper helper,SUNMemory *memptr,size_t mem_size,SUNMemoryType mem_type,
          void *queue)

{
  undefined8 *puVar1;
  void *pvVar2;
  int in_ECX;
  size_t in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  SUNMemory mem;
  SUNContext sunctx_local_scope_;
  undefined8 local_40;
  
  puVar1 = (undefined8 *)SUNMemoryNewEmpty(in_RDI[3]);
  *puVar1 = 0;
  *(undefined4 *)((long)puVar1 + 0xc) = 1;
  *(int *)(puVar1 + 1) = in_ECX;
  puVar1[2] = in_RDX;
  if (in_ECX == 0) {
    pvVar2 = malloc(in_RDX);
    *puVar1 = pvVar2;
    *(size_t *)(*in_RDI + 0x10) = in_RDX + *(long *)(*in_RDI + 0x10);
    *(long *)*in_RDI = *(long *)*in_RDI + 1;
    if (*(ulong *)(*in_RDI + 0x18) < *(ulong *)(*in_RDI + 0x10)) {
      local_40 = *(undefined8 *)(*in_RDI + 0x10);
    }
    else {
      local_40 = *(undefined8 *)(*in_RDI + 0x18);
    }
    *(undefined8 *)(*in_RDI + 0x18) = local_40;
  }
  *in_RSI = puVar1;
  return 0;
}

Assistant:

SUNErrCode SUNMemoryHelper_Alloc_Sys(SUNMemoryHelper helper, SUNMemory* memptr,
                                     size_t mem_size, SUNMemoryType mem_type,
                                     SUNDIALS_MAYBE_UNUSED void* queue)
{
  SUNFunctionBegin(helper->sunctx);

  SUNAssert(mem_type == SUNMEMTYPE_HOST, SUN_ERR_ARG_INCOMPATIBLE);

  SUNMemory mem = SUNMemoryNewEmpty(helper->sunctx);
  SUNCheckLastErr();

  mem->ptr   = NULL;
  mem->own   = SUNTRUE;
  mem->type  = mem_type;
  mem->bytes = mem_size;

  if (mem_type == SUNMEMTYPE_HOST)
  {
    mem->ptr = malloc(mem_size);
    SUNAssert(mem->ptr, SUN_ERR_MALLOC_FAIL);
    SUNHELPER_CONTENT(helper)->bytes_allocated += mem_size;
    SUNHELPER_CONTENT(helper)->num_allocations++;
    SUNHELPER_CONTENT(helper)->bytes_high_watermark =
      SUNMAX(SUNHELPER_CONTENT(helper)->bytes_allocated,
             SUNHELPER_CONTENT(helper)->bytes_high_watermark);
  }

  *memptr = mem;
  return SUN_SUCCESS;
}